

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  ulong uVar1;
  char *pcVar2;
  Stream *pSVar3;
  pointer pCVar4;
  ulong uVar5;
  long lVar6;
  
  Stream::Writef(this->json_stream_,"[");
  pCVar4 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar4) {
    lVar6 = 0x28;
    uVar5 = 0;
    do {
      Stream::Writef(this->json_stream_,"{");
      Stream::Writef(this->json_stream_,"\"%s\": ","type");
      switch(*(undefined4 *)((long)pCVar4 + lVar6 + -8)) {
      case 0xfffffffc:
        pSVar3 = this->json_stream_;
        pcVar2 = "f64";
        break;
      case 0xfffffffd:
        pSVar3 = this->json_stream_;
        pcVar2 = "f32";
        goto LAB_00f42eec;
      case 0xfffffffe:
        pSVar3 = this->json_stream_;
        pcVar2 = "i64";
        break;
      case 0xffffffff:
        pSVar3 = this->json_stream_;
        pcVar2 = "i32";
LAB_00f42eec:
        Stream::Writef(pSVar3,"\"%s\"",pcVar2);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"%u\"",
                       (ulong)*(uint *)((long)&(pCVar4->loc).filename.data_ + lVar6));
        goto LAB_00f42f34;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer-spec.cc"
                      ,0xcc,
                      "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteConst(const Const &)"
                     );
      }
      Stream::Writef(pSVar3,"\"%s\"",pcVar2);
      Stream::Writef(this->json_stream_,", ");
      Stream::Writef(this->json_stream_,"\"%s\": ","value");
      Stream::Writef(this->json_stream_,"\"%lu\"",
                     *(undefined8 *)((long)&(pCVar4->loc).filename.data_ + lVar6));
LAB_00f42f34:
      Stream::Writef(this->json_stream_,"}");
      pCVar4 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl
                     .super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) * 0x6db6db6db6db6db7;
      if (uVar5 != uVar1 - 1) {
        Stream::Writef(this->json_stream_,", ");
        pCVar4 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar1 = ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) *
                0x6db6db6db6db6db7;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x38;
    } while (uVar5 < uVar1);
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}